

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsScene::selectedItems(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsScene *this)

{
  long lVar1;
  QGraphicsItem *this_00;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QSet<QGraphicsItem_*> actuallySelectedSet;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_50.d = (Data *)0x0;
  lVar6 = *(long *)(lVar1 + 0x128);
  if (lVar6 == 0) {
    lVar6 = 0;
  }
  else if (**(char **)(lVar6 + 0x20) == -1) {
    uVar2 = 1;
    do {
      uVar5 = uVar2;
      if (*(ulong *)(lVar6 + 0x10) == uVar5) {
        lVar6 = 0;
        uVar5 = 0;
        break;
      }
      uVar2 = uVar5 + 1;
    } while ((*(char **)(lVar6 + 0x20))[(ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90] == -1);
    goto LAB_00612657;
  }
  uVar5 = 0;
LAB_00612657:
  do {
    if ((uVar5 == 0) && (lVar6 == 0)) {
      QHash<QGraphicsItem_*,_QHashDummyValue>::operator=
                ((QHash<QGraphicsItem_*,_QHashDummyValue> *)(*(long *)(this + 8) + 0x128),&local_50)
      ;
      QSet<QGraphicsItem_*>::values(__return_storage_ptr__,(QSet<QGraphicsItem_*> *)(lVar1 + 0x128))
      ;
      QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    lVar4 = (uVar5 >> 7) * 0x90;
    this_00 = *(QGraphicsItem **)
               (*(long *)(*(long *)(lVar6 + 0x20) + 0x80 + lVar4) +
               (ulong)*(byte *)((ulong)((uint)uVar5 & 0x7f) + *(long *)(lVar6 + 0x20) + lVar4) * 8);
    bVar3 = QGraphicsItem::isSelected(this_00);
    if (bVar3) {
      local_40 = this_00;
      QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_50,&local_40,&local_41);
    }
    do {
      if (*(long *)(lVar6 + 0x10) - 1U == uVar5) {
        uVar5 = 0;
        lVar6 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (*(char *)((ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90 + *(long *)(lVar6 + 0x20))
             == -1);
  } while( true );
}

Assistant:

QList<QGraphicsItem *> QGraphicsScene::selectedItems() const
{
    Q_D(const QGraphicsScene);

    // Optimization: Lazily removes items that are not selected.
    QGraphicsScene *that = const_cast<QGraphicsScene *>(this);
    QSet<QGraphicsItem *> actuallySelectedSet;
    for (QGraphicsItem *item : std::as_const(that->d_func()->selectedItems)) {
        if (item->isSelected())
            actuallySelectedSet << item;
    }

    that->d_func()->selectedItems = actuallySelectedSet;

    return d->selectedItems.values();
}